

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O1

int __thiscall
CECoordinates::ICRS2Observed
          (CECoordinates *this,double ra,double dec,double *az,double *zen,double julian_date,
          double longitude,double latitude,double elevation_m,double pressure_hPa,
          double temperature_celsius,double relative_humidity,double dut1,double xp,double yp,
          double wavelength_um,double *observed_ra,double *observed_dec,double *hour_angle)

{
  int iVar1;
  double *observed_dec_00;
  double temp_hour_angle;
  double temp_dec;
  double temp_ra;
  CEDate date;
  CEAngleType local_dc;
  CECoordinates *local_d8;
  double *local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  CEDate local_70;
  
  local_78 = 0.0;
  local_80 = 0.0;
  if (zen == (double *)0x0) {
    zen = &local_78;
  }
  local_98 = 0.0;
  if (observed_ra == (double *)0x0) {
    observed_ra = &local_80;
  }
  local_d8 = this;
  local_d0 = az;
  local_c8 = julian_date;
  local_c0 = longitude;
  local_b8 = latitude;
  local_b0 = elevation_m;
  local_a8 = pressure_hPa;
  local_a0 = temperature_celsius;
  local_90 = dec;
  local_88 = ra;
  CEDate::CEDate(&local_70,julian_date,JD);
  local_dc = RADIANS;
  ICRS2CIRS(local_88,local_90,&local_88,&local_90,&local_70,&local_dc);
  observed_dec_00 = &local_98;
  if (observed_dec != (double *)0x0) {
    observed_dec_00 = observed_dec;
  }
  iVar1 = CIRS2Observed(local_d8,local_88,local_90,local_d0,zen,local_c8,local_c0,local_b8,local_b0,
                        local_a8,local_a0,relative_humidity,dut1,xp,yp,wavelength_um,observed_ra,
                        observed_dec_00,hour_angle);
  local_dc = RADIANS;
  CIRS2ICRS(*zen,*observed_ra,zen,observed_ra,&local_70,&local_dc);
  CEDate::~CEDate(&local_70);
  return iVar1;
}

Assistant:

int CECoordinates::ICRS2Observed(double ra, double dec,
                                 double *az, double *zen,
                                 double julian_date,
                                 double longitude,
                                 double latitude,
                                 double elevation_m,
                                 double pressure_hPa,
                                 double temperature_celsius,
                                 double relative_humidity,
                                 double dut1,
                                 double xp, double yp,
                                 double wavelength_um,
                                 double *observed_ra,
                                 double *observed_dec,
                                 double *hour_angle)
{
    // Setup the observed RA, Dec and hour_angle variables
    double temp_ra(0.0);
    double temp_dec(0.0);
    double temp_hour_angle(0.0);

    // If values were passed, point these variables at the passed ones
    if (observed_ra  == nullptr) observed_ra  = &temp_ra;
    if (observed_dec == nullptr) observed_dec = &temp_dec;
    if (hour_angle   == nullptr) hour_angle   = &temp_hour_angle;
    
    // First convert the ICRS coordinates to CIRS coordinates
    CEDate date(julian_date, CEDateType::JD) ;
    ICRS2CIRS(ra, dec, &ra, &dec, date) ;
    
    // Call the necessary sofa method
    int err_code = CIRS2Observed(ra, dec,
                                 az, zen,
                                 julian_date,
                                 longitude,
                                 latitude,
                                 elevation_m,
                                 pressure_hPa,
                                 temperature_celsius,
                                 relative_humidity,
                                 dut1, xp, yp,
                                 wavelength_um,
                                 observed_ra,
                                 observed_dec,
                                 hour_angle) ;
    
    // Convert the apparent CIRS RA,Dec to ICRS RA,Dec
    CIRS2ICRS(*observed_ra, *observed_dec, observed_ra, observed_dec, 
              date, CEAngleType::RADIANS) ;
    
    return err_code ;
}